

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDateTime>::emplace<QDateTime>
          (QMovableArrayOps<QDateTime> *this,qsizetype i,QDateTime *args)

{
  QDateTime **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QDateTime *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QDateTime tmp;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0019179e:
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QDateTime::QDateTime((QDateTime *)&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size != 0;
    QArrayDataPointer<QDateTime>::detachAndGrow
              ((QArrayDataPointer<QDateTime> *)this,(uint)(i == 0 && bVar6),1,(QDateTime **)0x0,
               (QArrayDataPointer<QDateTime> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr;
    if (i == 0 && bVar6) {
      QDateTime::QDateTime(pQVar5 + -8,(QDateTime *)&local_30);
      ppQVar1 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr;
      *ppQVar1 = *ppQVar1 + -8;
    }
    else {
      memmove(pQVar5 + i * 8 + 8,pQVar5 + i * 8,
              ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size - i
              ) * 8);
      QDateTime::QDateTime(pQVar5 + i * 8,(QDateTime *)&local_30);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size;
    *pqVar2 = *pqVar2 + 1;
    QDateTime::~QDateTime((QDateTime *)&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.
                      ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QDateTime::QDateTime
                ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr +
                 lVar4 * 8,args);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QDateTime *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr))
      goto LAB_0019179e;
      QDateTime::QDateTime
                ((this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr +
                 -8,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.ptr;
      *ppQVar1 = *ppQVar1 + -8;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDateTime>).super_QArrayDataPointer<QDateTime>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }